

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void jmp_list_append(Parser *psr,int *head,int to_add)

{
  BcIns *pBVar1;
  
  if (*head != -1) {
    pBVar1 = psr->vm->fns[psr->scope->fn].ins;
    pBVar1[to_add] = (*head - to_add) * 0x100 + (uint)(byte)pBVar1[to_add] + 0x7fffff00;
    *head = to_add;
    return;
  }
  *head = to_add;
  pBVar1 = psr->vm->fns[psr->scope->fn].ins;
  pBVar1[to_add] = ~to_add * 0x100 + (uint)(byte)pBVar1[to_add] + 0x7fffff00;
  return;
}

Assistant:

static void jmp_list_append(Parser *psr, int *head, int to_add) {
	if (*head == -1) {
		// Nothing in the jump list yet; set the head
		*head = to_add;

		// Reset the target of the jump to add, in case it was pointing to
		// something else previously
		jmp_set_target(psr, to_add, -1);
	} else {
		jmp_set_target(psr, to_add, *head);
		*head = to_add;
	}
}